

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O2

void * __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::AddInternal<void*(*)(google::protobuf::Arena*)>
          (RepeatedPtrFieldBase *this,_func_void_ptr_Arena_ptr *factory)

{
  Arena *pAVar1;
  bool bVar2;
  int __old_val;
  int iVar3;
  void **ppvVar4;
  void *pvVar5;
  Rep *pRVar6;
  int iVar7;
  
  pvVar5 = this->tagged_rep_or_elem_;
  pAVar1 = this->arena_;
  if (pvVar5 == (void *)0x0) {
    this->current_size_ = 1;
    pvVar5 = (*factory)(pAVar1);
    this->tagged_rep_or_elem_ = pvVar5;
  }
  else if (((ulong)pvVar5 & 1) == 0) {
    if (this->current_size_ == 0) {
      this->current_size_ = 1;
    }
    else {
      ppvVar4 = InternalExtend(this,1);
      pvVar5 = (*factory)(pAVar1);
      *ppvVar4 = pvVar5;
      pRVar6 = rep(this);
      pRVar6->allocated_size = 2;
      this->current_size_ = 2;
      pvVar5 = *ppvVar4;
    }
  }
  else {
    pRVar6 = rep(this);
    bVar2 = SizeAtCapacity(this);
    if (bVar2) {
      InternalExtend(this,1);
      pRVar6 = rep(this);
      iVar3 = this->current_size_;
      iVar7 = pRVar6->allocated_size;
    }
    else {
      iVar3 = this->current_size_;
      iVar7 = iVar3;
      if (iVar3 != pRVar6->allocated_size) {
        this->current_size_ = iVar3 + 1;
        return pRVar6->elements[iVar3];
      }
    }
    pRVar6->allocated_size = iVar7 + 1;
    this->current_size_ = iVar3 + 1;
    pvVar5 = (*factory)(pAVar1);
    pRVar6->elements[iVar3] = pvVar5;
  }
  return pvVar5;
}

Assistant:

void* RepeatedPtrFieldBase::AddInternal(Factory factory) {
  Arena* const arena = GetArena();
  if (tagged_rep_or_elem_ == nullptr) {
    ExchangeCurrentSize(1);
    tagged_rep_or_elem_ = factory(arena);
    return tagged_rep_or_elem_;
  }
  absl::PrefetchToLocalCache(tagged_rep_or_elem_);
  if (using_sso()) {
    if (current_size_ == 0) {
      ExchangeCurrentSize(1);
      return tagged_rep_or_elem_;
    }
    void*& result = *InternalExtend(1);
    result = factory(arena);
    Rep* r = rep();
    r->allocated_size = 2;
    ExchangeCurrentSize(2);
    return result;
  }
  Rep* r = rep();
  if (ABSL_PREDICT_FALSE(SizeAtCapacity())) {
    InternalExtend(1);
    r = rep();
  } else {
    if (current_size_ != r->allocated_size) {
      return r->elements[ExchangeCurrentSize(current_size_ + 1)];
    }
  }
  ++r->allocated_size;
  void*& result = r->elements[ExchangeCurrentSize(current_size_ + 1)];
  result = factory(arena);
  return result;
}